

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void vkt::pipeline::uploadTestTexture
               (DeviceInterface *vk,VkDevice device,VkQueue queue,deUint32 queueFamilyIndex,
               Allocator *allocator,TestTexture *srcTexture,VkImage destImage)

{
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TextureFormat TVar3;
  TestTexture *pTVar4;
  TestTexture *srcStencilTexture_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TestTexture *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_e0;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_d0;
  TextureFormat local_c0;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_b8;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_a8;
  TextureFormat local_94;
  TextureFormat local_8c;
  TextureFormat local_84;
  TextureFormat local_7c;
  TextureFormat format;
  undefined1 local_68 [8];
  MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
  srcStencilTexture;
  MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
  srcDepthTexture;
  TestTexture *srcTexture_local;
  Allocator *allocator_local;
  deUint32 queueFamilyIndex_local;
  VkQueue queue_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkImage destImage_local;
  
  iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
  bVar1 = tcu::isCombinedDepthStencilType(*(ChannelType *)(CONCAT44(extraout_var,iVar2) + 4));
  if (bVar1) {
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
              ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                *)&srcStencilTexture.
                   super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                   .m_data.field_0x8);
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
              ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                *)local_68);
    iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
    bVar1 = tcu::hasDepthComponent(*(ChannelOrder *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      tcu::TextureFormat::TextureFormat(&local_7c);
      iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
      iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 4);
      if (iVar2 == 0x18) {
        tcu::TextureFormat::TextureFormat(&local_84,D,UNORM_INT16);
        local_7c = local_84;
      }
      else if (iVar2 == 0x1a) {
        tcu::TextureFormat::TextureFormat(&local_8c,D,UNSIGNED_INT_24_8_REV);
        local_7c = local_8c;
      }
      else if (iVar2 == 0x25) {
        tcu::TextureFormat::TextureFormat(&local_94,D,FLOAT);
        local_7c = local_94;
      }
      local_c0 = local_7c;
      pTVar4 = srcTexture;
      (*srcTexture->_vptr_TestTexture[0xd])(&local_b8,srcTexture,local_7c);
      local_a8 = de::details::MovePtr::operator_cast_to_PtrData(&local_b8,(MovePtr *)pTVar4);
      data._8_8_ = in_stack_fffffffffffffe20;
      data.ptr = in_stack_fffffffffffffe18;
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
      operator=((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                 *)&srcStencilTexture.
                    super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                    .m_data.field_0x8,data);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_b8);
    }
    iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
    bVar1 = tcu::hasStencilComponent(*(ChannelOrder *)CONCAT44(extraout_var_02,iVar2));
    if (bVar1) {
      iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
      TVar3 = tcu::getEffectiveDepthStencilTextureFormat
                        ((TextureFormat *)CONCAT44(extraout_var_03,iVar2),MODE_STENCIL);
      pTVar4 = srcTexture;
      (*srcTexture->_vptr_TestTexture[0xd])(&local_e0,srcTexture,TVar3);
      local_d0 = de::details::MovePtr::operator_cast_to_PtrData(&local_e0,(MovePtr *)pTVar4);
      data_00._8_8_ = in_stack_fffffffffffffe20;
      data_00.ptr = in_stack_fffffffffffffe18;
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
      operator=((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                 *)local_68,data_00);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_e0);
    }
    pTVar4 = de::details::
             UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             ::operator*((UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                          *)&srcStencilTexture.
                             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                             .m_data.field_0x8);
    srcStencilTexture_00 =
         de::details::
         UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
         get((UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
              *)local_68);
    iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
    uploadTestTextureInternal
              (vk,device,queue,queueFamilyIndex,allocator,pTVar4,srcStencilTexture_00,
               *(TextureFormat *)CONCAT44(extraout_var_04,iVar2),destImage);
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
              ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                *)local_68);
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
              ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                *)&srcStencilTexture.
                   super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                   .m_data.field_0x8);
  }
  else {
    iVar2 = (*srcTexture->_vptr_TestTexture[0xe])();
    uploadTestTextureInternal
              (vk,device,queue,queueFamilyIndex,allocator,srcTexture,(TestTexture *)0x0,
               *(TextureFormat *)CONCAT44(extraout_var_05,iVar2),destImage);
  }
  return;
}

Assistant:

void uploadTestTexture (const DeviceInterface&			vk,
						VkDevice						device,
						VkQueue							queue,
						deUint32						queueFamilyIndex,
						Allocator&						allocator,
						const TestTexture&				srcTexture,
						VkImage							destImage)
{
	if (tcu::isCombinedDepthStencilType(srcTexture.getTextureFormat().type))
	{
		de::MovePtr<TestTexture> srcDepthTexture;
		de::MovePtr<TestTexture> srcStencilTexture;

		if (tcu::hasDepthComponent(srcTexture.getTextureFormat().order))
		{
			tcu::TextureFormat format;
			switch (srcTexture.getTextureFormat().type) {
			case tcu::TextureFormat::UNSIGNED_INT_16_8_8:
				format = tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::UNORM_INT16);
				break;
			case tcu::TextureFormat::UNSIGNED_INT_24_8_REV:
				format = tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::UNSIGNED_INT_24_8_REV);
				break;
			case tcu::TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
				format = tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
			srcDepthTexture = srcTexture.copy(format);
		}

		if (tcu::hasStencilComponent(srcTexture.getTextureFormat().order))
			srcStencilTexture = srcTexture.copy(tcu::getEffectiveDepthStencilTextureFormat(srcTexture.getTextureFormat(), tcu::Sampler::MODE_STENCIL));

		uploadTestTextureInternal(vk, device, queue, queueFamilyIndex, allocator, *srcDepthTexture, srcStencilTexture.get(), srcTexture.getTextureFormat(), destImage);
	}
	else
		uploadTestTextureInternal(vk, device, queue, queueFamilyIndex, allocator, srcTexture, DE_NULL, srcTexture.getTextureFormat(), destImage);
}